

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent)

{
  int iVar1;
  Parser *pPVar2;
  Type *pTVar3;
  Tokenizer *pTVar4;
  int iVar5;
  Type *pTVar6;
  
  pPVar2 = parent->parser_;
  this->parser_ = pPVar2;
  pTVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                     (&(pPVar2->source_code_info_->location_).super_RepeatedPtrFieldBase,(Type *)0x0
                     );
  this->location_ = pTVar3;
  pTVar6 = parent->location_;
  if (pTVar6 != pTVar3) {
    (pTVar3->path_).current_size_ = 0;
    iVar1 = (pTVar6->path_).current_size_;
    if (iVar1 != 0) {
      RepeatedField<int>::Reserve(&pTVar3->path_,iVar1);
      memcpy(((pTVar3->path_).rep_)->elements + (pTVar3->path_).current_size_,
             ((pTVar6->path_).rep_)->elements,(long)(pTVar6->path_).current_size_ << 2);
      (pTVar3->path_).current_size_ = (pTVar3->path_).current_size_ + (pTVar6->path_).current_size_;
      pTVar3 = this->location_;
    }
  }
  pTVar4 = this->parser_->input_;
  iVar1 = (pTVar4->current_).line;
  iVar5 = (pTVar3->span_).current_size_;
  pTVar6 = pTVar3;
  if (iVar5 == (pTVar3->span_).total_size_) {
    RepeatedField<int>::Reserve(&pTVar3->span_,iVar5 + 1);
    iVar5 = (pTVar3->span_).current_size_;
    pTVar4 = this->parser_->input_;
    pTVar6 = this->location_;
  }
  (pTVar3->span_).current_size_ = iVar5 + 1;
  ((pTVar3->span_).rep_)->elements[iVar5] = iVar1;
  iVar1 = (pTVar4->current_).column;
  iVar5 = (pTVar6->span_).current_size_;
  if (iVar5 == (pTVar6->span_).total_size_) {
    RepeatedField<int>::Reserve(&pTVar6->span_,iVar5 + 1);
    iVar5 = (pTVar6->span_).current_size_;
  }
  (pTVar6->span_).current_size_ = iVar5 + 1;
  ((pTVar6->span_).rep_)->elements[iVar5] = iVar1;
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent) {
  parser_ = parent.parser_;
  location_ = parser_->source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}